

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::UBOToSSBOInvertCase::iterate(UBOToSSBOInvertCase *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RenderContext *renderCtx;
  ContextType type;
  GLSLVersion version;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  GLuint index;
  GLenum GVar6;
  char *__s;
  size_t sVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar9;
  undefined4 extraout_var_01;
  TestError *pTVar10;
  long *plVar11;
  uint uVar12;
  ulong uVar13;
  size_type *psVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  BufferMemMap bufMap;
  InterfaceBlockInfo blockInfo;
  BufferMemMap bufMap_1;
  Buffer outputBuffer;
  Buffer inputBuffer;
  Random rnd;
  ShaderProgram program;
  ostringstream src;
  undefined4 local_508;
  uint local_504;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_500;
  undefined1 local_4e8 [32];
  InterfaceBlockInfo local_4c8;
  BufferMemMap local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  ObjectWrapper local_448;
  ObjectWrapper local_430;
  string local_418;
  undefined1 local_3f8 [8];
  pointer local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  pointer local_3d8;
  deUint32 local_3d0;
  undefined8 local_3cc;
  uint uStack_3c4;
  int iStack_3c0;
  undefined5 uStack_3bc;
  undefined8 uStack_3b7;
  ios_base local_380 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_368;
  undefined1 local_348 [208];
  ShaderProgram local_278;
  undefined1 local_1a8 [376];
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = glu::getGLSLVersionDeclaration(version);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(_func_int *)
                         ((long)&local_508 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x360
                   );
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout (local_size_x = ",0x17);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", local_size_y = ",0x11);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", local_size_z = ",0x11);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->m_localSize).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"uniform Input {\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    uint values[",0x10);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_numValues);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} ub_in;\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(binding = 1) buffer Output {\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    uint values[",0x10);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->m_numValues);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"} sb_out;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n",
             0x51);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,
             "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
             ,0x7d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    uint offset          = numValuesPerInv*groupNdx;\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_3f8,0,0xac);
  local_348._0_8_ = (pointer)0x0;
  local_348[8] = 0;
  local_348._9_7_ = 0;
  local_348[0x10] = 0;
  local_348._17_8_ = 0;
  std::__cxx11::stringbuf::str();
  psVar14 = &local_4c8.name._M_string_length;
  local_4c8.name._M_dataplus._M_p._0_4_ = 5;
  puVar1 = (undefined1 *)((long)&local_4c8.name.field_2 + 8);
  local_4c8.name._M_string_length = (size_type)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar14,local_4e8._0_8_,
             (pointer)(local_4e8._0_8_ + CONCAT44(local_4e8._12_4_,local_4e8._8_4_)));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + ((ulong)local_4c8.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)psVar14);
  glu::ShaderProgram::ShaderProgram(&local_278,renderCtx,(ProgramSources *)local_3f8);
  if ((undefined1 *)local_4c8.name._M_string_length != puVar1) {
    operator_delete((void *)local_4c8.name._M_string_length,local_4c8.name.field_2._8_8_ + 1);
  }
  if ((Functions *)local_4e8._0_8_ != (Functions *)(local_4e8 + 0x10)) {
    operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_368);
  lVar18 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + lVar18));
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0x18);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_430,(Functions *)CONCAT44(extraout_var_00,iVar3),pOVar9);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar9 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_448,(Functions *)CONCAT44(extraout_var_01,iVar3),pOVar9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_500,(long)this->m_numValues,(allocator_type *)local_3f8);
  deRandom_init((deRandom *)local_3f8,0x111223f);
  if (0 < (int)((ulong)((long)local_500.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_500.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    lVar18 = 0;
    do {
      dVar4 = deRandom_getUint32((deRandom *)local_3f8);
      local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar18] = dVar4;
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)((ulong)((long)local_500.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_500.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_278
                 );
  if (local_278.m_program.m_info.linkOk == false) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0xa8);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_3f8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3f0,"Work groups: ",0xd);
  tcu::operator<<((ostream *)&local_3f0,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3f0);
  std::ios_base::~ios_base(local_380);
  (*gl->useProgram)(local_278.m_program.m_program);
  GVar5 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e2,"Input");
  paVar2 = &local_4c8.name.field_2;
  local_4c8.name._M_string_length = 0;
  local_4c8.name.field_2._M_allocated_capacity =
       local_4c8.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_4c8.index = 0xffffffff;
  local_4c8.bufferBinding = 0;
  local_4c8.dataSize = 0;
  local_4c8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c8.name._M_dataplus._M_p = (pointer)paVar2;
  glu::getProgramInterfaceBlockInfo(gl,local_278.m_program.m_program,0x92e2,GVar5,&local_4c8);
  index = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e1,"Input.values");
  local_3f0 = (pointer)0x0;
  local_3e8._M_local_buf[0] = '\0';
  local_3d8 = (pointer)&DAT_ffffffffffffffff;
  local_3d0 = 0xffffffff;
  local_3cc = 0;
  uStack_3c4 = 0;
  iStack_3c0 = 0;
  uStack_3bc = 0;
  uStack_3b7 = 0;
  local_3f8 = (undefined1  [8])&local_3e8;
  glu::getProgramInterfaceVariableInfo
            (gl,local_278.m_program.m_program,0x92e1,index,(InterfaceVariableInfo *)local_3f8);
  (*gl->bindBuffer)(0x8a11,local_430.m_object);
  (*gl->bufferData)(0x8a11,(ulong)local_4c8.dataSize,(void *)0x0,0x88e4);
  BufferMemMap::BufferMemMap((BufferMemMap *)local_4e8,gl,0x8a11,0,local_4c8.dataSize,2);
  uVar13 = (ulong)((long)local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar12 = (uint)uVar13;
  uVar16 = local_3cc._4_4_;
  if (uVar12 <= local_3cc._4_4_) {
    uVar16 = uVar12;
  }
  if (uVar16 != 0) {
    uVar15 = 0;
    do {
      *(uint *)((ulong)(uint)(iStack_3c0 * (int)uVar15) + (ulong)uStack_3c4 + local_4e8._16_8_) =
           local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar15];
      uVar15 = uVar15 + 1;
      uVar17 = (ulong)local_3cc._4_4_;
      if (uVar12 <= local_3cc._4_4_) {
        uVar17 = uVar13 & 0xffffffff;
      }
    } while (uVar15 < uVar17);
  }
  (**(glUnmapBufferFunc *)(local_4e8._0_8_ + 0x1670))(local_4e8._8_4_);
  (*gl->uniformBlockBinding)(local_278.m_program.m_program,GVar5,0);
  (*gl->bindBufferBase)(0x8a11,0,local_430.m_object);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Input buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xc1);
  if (local_3f8 != (undefined1  [8])&local_3e8) {
    operator_delete((void *)local_3f8,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  if (local_4c8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4c8.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c8.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_4c8.name._M_dataplus._M_p,local_4c8.name.field_2._M_allocated_capacity + 1
                   );
  }
  GVar5 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,local_278.m_program.m_program,0x92e6,GVar5,0x9303);
  (*gl->bindBuffer)(0x90d2,local_448.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar4,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,1,local_448.m_object);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xcc);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0xd1);
  GVar5 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e6,"Output");
  dVar4 = glu::getProgramResourceUint(gl,local_278.m_program.m_program,0x92e6,GVar5,0x9303);
  GVar5 = (*gl->getProgramResourceIndex)(local_278.m_program.m_program,0x92e5,"Output.values");
  local_3f0 = (pointer)0x0;
  local_3e8._M_local_buf[0] = '\0';
  local_3d8 = (pointer)&DAT_ffffffffffffffff;
  local_3d0 = 0xffffffff;
  local_3cc = 0;
  uStack_3c4 = 0;
  iStack_3c0 = 0;
  uStack_3bc = 0;
  uStack_3b7 = 0;
  local_3f8 = (undefined1  [8])&local_3e8;
  glu::getProgramInterfaceVariableInfo
            (gl,local_278.m_program.m_program,0x92e5,GVar5,(InterfaceVariableInfo *)local_3f8);
  BufferMemMap::BufferMemMap(&local_480,gl,0x90d2,0,dVar4,1);
  if (local_3cc._4_4_ ==
      (uint)((ulong)((long)local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    local_504 = 0;
    if ((ulong)local_3cc._4_4_ != 0) {
      uVar16 = 0;
      uVar13 = 0;
      do {
        if ((local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13] ^
            *(uint *)((long)local_480.m_ptr + (ulong)uVar16 + (ulong)uStack_3c4)) != 0xffffffff) {
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_468,"Comparison failed for Output.values[","");
          de::toString<unsigned_int>(&local_418,&local_504);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4e8,&local_468,&local_418);
          plVar11 = (long *)std::__cxx11::string::append(local_4e8);
          local_4c8.name._M_dataplus._M_p = (pointer)*plVar11;
          psVar14 = (size_type *)(plVar11 + 2);
          if ((size_type *)local_4c8.name._M_dataplus._M_p == psVar14) {
            local_4c8.name.field_2._M_allocated_capacity = *psVar14;
            local_4c8.name.field_2._8_8_ = plVar11[3];
            local_4c8.name._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_4c8.name.field_2._M_allocated_capacity = *psVar14;
          }
          local_4c8.name._M_string_length = plVar11[1];
          *plVar11 = (long)psVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_508 = (undefined4)CONCAT71((int7)((ulong)plVar11 >> 8),1);
          tcu::TestError::TestError(pTVar10,&local_4c8.name);
          local_508 = 0;
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        uVar13 = uVar13 + 1;
        local_504 = (uint)uVar13;
        uVar16 = uVar16 + iStack_3c0;
      } while (local_3cc._4_4_ != uVar13);
    }
    (*(local_480.m_gl)->unmapBuffer)(local_480.m_target);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,
                      CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1)
      ;
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    if (local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_500.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_500.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_500.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    glu::ObjectWrapper::~ObjectWrapper(&local_448);
    glu::ObjectWrapper::~ObjectWrapper(&local_430);
    glu::ShaderProgram::~ShaderProgram(&local_278);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return STOP;
  }
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0xdb);
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream	src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "uniform Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} ub_in;\n"
			<< "layout(binding = 1) buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		std::vector<deUint32>		inputValues		(m_numValues);

		// Compute input values.
		{
			de::Random rnd(0x111223f);
			for (int ndx = 0; ndx < (int)inputValues.size(); ndx++)
				inputValues[ndx] = rnd.getUint32();
		}

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_UNIFORM_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_UNIFORM, valueIndex);

			gl.bindBuffer(GL_UNIFORM_BUFFER, *inputBuffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			{
				const BufferMemMap bufMap(gl, GL_UNIFORM_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < de::min(valueInfo.arraySize, (deUint32)inputValues.size()); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.uniformBlockBinding(program.getProgram(), blockIndex, 0);
			gl.bindBufferBase(GL_UNIFORM_BUFFER, 0, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());
			for (deUint32 ndx = 0; ndx < valueInfo.arraySize; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*ndx));
				const deUint32	ref		= ~inputValues[ndx];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(ndx) + "]");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}